

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pass.cpp
# Opt level: O0

bool __thiscall spvtools::opt::MemPass::RemoveUnreachableBlocks(MemPass *this,Function *func)

{
  BasicBlock *pBVar1;
  bool bVar2;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *puVar3;
  reference ppBVar4;
  size_type sVar5;
  reference local_1f8;
  iterator local_1f0;
  undefined1 local_1e0 [8];
  iterator ebi;
  function<void_(spvtools::opt::Instruction_*)> local_1c0;
  reference local_1a0;
  BasicBlock *local_198;
  value_type *block_1;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  function<void_(unsigned_int)> local_148;
  BasicBlock *local_128;
  BasicBlock *block;
  anon_class_32_4_f94b8823 mark_reachable;
  pointer local_e8;
  undefined1 local_e0 [8];
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  worklist;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  visited_blocks;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  reachable_blocks;
  bool modified;
  Function *func_local;
  MemPass *this_local;
  
  reachable_blocks._M_h._M_single_bucket._7_1_ = false;
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&visited_blocks._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&worklist.c.
                      super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
  ::queue<std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>,void>
            ((queue<spvtools::opt::BasicBlock*,std::deque<spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>>>
              *)local_e0);
  puVar3 = Function::entry(func);
  local_e8 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::get(puVar3);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::insert((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            *)&visited_blocks._M_h._M_single_bucket,&local_e8);
  puVar3 = Function::entry(func);
  mark_reachable.this =
       (MemPass *)
       std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
       get(puVar3);
  std::
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  ::push((queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
          *)local_e0,(value_type *)&mark_reachable.this);
  block = (BasicBlock *)&visited_blocks._M_h._M_single_bucket;
  mark_reachable.reachable_blocks =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)&worklist.c.
           super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
  mark_reachable.visited_blocks =
       (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
        *)local_e0;
  mark_reachable.worklist =
       (queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
        *)this;
  while (bVar2 = std::
                 queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                 ::empty((queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                          *)local_e0), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppBVar4 = std::
              queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
              ::front((queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                       *)local_e0);
    local_128 = *ppBVar4;
    std::
    queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
    ::pop((queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
           *)local_e0);
    pBVar1 = local_128;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::MemPass::RemoveUnreachableBlocks(spvtools::opt::Function*)::__0&,void>
              ((function<void(unsigned_int)> *)&local_148,(anon_class_32_4_f94b8823 *)&block);
    BasicBlock::ForEachSuccessorLabel(pBVar1,&local_148);
    std::function<void_(unsigned_int)>::~function(&local_148);
    pBVar1 = local_128;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::MemPass::RemoveUnreachableBlocks(spvtools::opt::Function*)::__0&,void>
              ((function<void(unsigned_int)> *)&__range2,(anon_class_32_4_f94b8823 *)&block);
    BasicBlock::ForMergeAndContinueLabel(pBVar1,(function<void_(unsigned_int)> *)&__range2);
    std::function<void_(unsigned_int)>::~function((function<void_(unsigned_int)> *)&__range2);
  }
  join_0x00000010_0x00000000_ = Function::begin(func);
  _block_1 = Function::end(func);
  while (bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                            &__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&block_1), bVar2
        ) {
    local_1a0 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_
                          );
    local_198 = local_1a0;
    sVar5 = std::
            unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ::count((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&visited_blocks._M_h._M_single_bucket,&local_1a0);
    pBVar1 = local_198;
    if (sVar5 != 0) {
      ebi.iterator_._M_current =
           (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *
           )&visited_blocks._M_h._M_single_bucket;
      std::function<void(spvtools::opt::Instruction*)>::
      function<spvtools::opt::MemPass::RemoveUnreachableBlocks(spvtools::opt::Function*)::__1,void>
                ((function<void(spvtools::opt::Instruction*)> *)&local_1c0,
                 (anon_class_16_2_54dba3ff *)&ebi.iterator_);
      BasicBlock::ForEachPhiInst(pBVar1,&local_1c0,false);
      std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_1c0);
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  _local_1e0 = Function::begin(func);
  while( true ) {
    local_1f0 = Function::end(func);
    bVar2 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_1e0,&local_1f0)
    ;
    if (!bVar2) break;
    local_1f8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                          ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_1e0);
    sVar5 = std::
            unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ::count((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                     *)&visited_blocks._M_h._M_single_bucket,&local_1f8);
    if (sVar5 == 0) {
      RemoveBlock(this,(iterator *)local_1e0);
      reachable_blocks._M_h._M_single_bucket._7_1_ = true;
    }
    else {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_1e0);
    }
  }
  std::
  queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
  ::~queue((queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
            *)local_e0);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&worklist.c.
                       super__Deque_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&visited_blocks._M_h._M_single_bucket);
  return reachable_blocks._M_h._M_single_bucket._7_1_;
}

Assistant:

bool MemPass::RemoveUnreachableBlocks(Function* func) {
  bool modified = false;

  // Mark reachable all blocks reachable from the function's entry block.
  std::unordered_set<BasicBlock*> reachable_blocks;
  std::unordered_set<BasicBlock*> visited_blocks;
  std::queue<BasicBlock*> worklist;
  reachable_blocks.insert(func->entry().get());

  // Initially mark the function entry point as reachable.
  worklist.push(func->entry().get());

  auto mark_reachable = [&reachable_blocks, &visited_blocks, &worklist,
                         this](uint32_t label_id) {
    auto successor = cfg()->block(label_id);
    if (visited_blocks.count(successor) == 0) {
      reachable_blocks.insert(successor);
      worklist.push(successor);
      visited_blocks.insert(successor);
    }
  };

  // Transitively mark all blocks reachable from the entry as reachable.
  while (!worklist.empty()) {
    BasicBlock* block = worklist.front();
    worklist.pop();

    // All the successors of a live block are also live.
    static_cast<const BasicBlock*>(block)->ForEachSuccessorLabel(
        mark_reachable);

    // All the Merge and ContinueTarget blocks of a live block are also live.
    block->ForMergeAndContinueLabel(mark_reachable);
  }

  // Update operands of Phi nodes that reference unreachable blocks.
  for (auto& block : *func) {
    // If the block is about to be removed, don't bother updating its
    // Phi instructions.
    if (reachable_blocks.count(&block) == 0) {
      continue;
    }

    // If the block is reachable and has Phi instructions, remove all
    // operands from its Phi instructions that reference unreachable blocks.
    // If the block has no Phi instructions, this is a no-op.
    block.ForEachPhiInst([&reachable_blocks, this](Instruction* phi) {
      RemovePhiOperands(phi, reachable_blocks);
    });
  }

  // Erase unreachable blocks.
  for (auto ebi = func->begin(); ebi != func->end();) {
    if (reachable_blocks.count(&*ebi) == 0) {
      RemoveBlock(&ebi);
      modified = true;
    } else {
      ++ebi;
    }
  }

  return modified;
}